

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutil.c
# Opt level: O2

PmError Pm_SetOverflow(PmQueue *q)

{
  if (q == (PmQueue *)0x0) {
    return pmBadPtr;
  }
  if (*(long *)((long)q + 0x18) != 0) {
    return pmBufferOverflow;
  }
  *(long *)((long)q + 0x18) = *(long *)((long)q + 8) + 1;
  return pmBufferOverflow;
}

Assistant:

PMEXPORT PmError Pm_SetOverflow(PmQueue *q)
{
    PmQueueRep *queue = (PmQueueRep *) q;
    long tail;
    /* arg checking */
    if (!queue)
        return pmBadPtr;
    /* no more enqueue until receiver acknowledges overflow */
    if (queue->overflow) return pmBufferOverflow;
    tail = queue->tail;
    queue->overflow = tail + 1;
    return pmBufferOverflow;
}